

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

Format embree::Texture::string_to_format(string *str)

{
  int iVar1;
  Format FVar2;
  runtime_error *this;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  if (iVar1 == 0) {
    FVar2 = RGBA8;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)str);
    if (iVar1 == 0) {
      FVar2 = RGB8;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)str);
      FVar2 = FLOAT32;
      if (iVar1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid texture format string");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return FVar2;
}

Assistant:

Texture::Format Texture::string_to_format(const std::string& str)
  {
    if      (str == "RGBA8") return RGBA8;
    else if (str == "RGB8")  return RGB8;
    else if (str == "FLOAT32") return FLOAT32;
    else THROW_RUNTIME_ERROR("invalid texture format string");
  }